

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_SegwitAddressFromHashTest_Test::~Address_SegwitAddressFromHashTest_Test
          (Address_SegwitAddressFromHashTest_Test *this)

{
  Address_SegwitAddressFromHashTest_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(Address, SegwitAddressFromHashTest) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(pubkey_hash);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  const Script &script = builder.Build();
  ByteData256 script_hash = HashUtil::Sha256(script);

  Address address;
  EXPECT_NO_THROW((address = Address(NetType::kMainnet,
                   WitnessVersion::kVersion0,
                   ByteData(pubkey_hash.GetBytes()))));
  EXPECT_STREQ("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address(NetType::kTestnet,
                   WitnessVersion::kVersion0,
                   ByteData(script_hash.GetBytes()))));
  EXPECT_STREQ("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());

  EXPECT_NO_THROW((address = Address(NetType::kRegtest,
                   WitnessVersion::kVersion0,
                   ByteData(pubkey_hash.GetBytes()))));
  EXPECT_STREQ("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());

  // Illegal data
  EXPECT_THROW((address = Address(NetType::kRegtest,
                   WitnessVersion::kVersion0, ByteData())),
               CfdException);
}